

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

string * __thiscall
Compiler::extractFileName_abi_cxx11_(string *__return_storage_ptr__,Compiler *this)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = (this->filePath)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->filePath)._M_dataplus._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == '.') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Compiler::extractFileName() {
    std::string fileName;

    for (const auto &c : filePath) {
        if (c == '.') break;
        fileName += c;
    }

    return fileName;
}